

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O2

void JSONWorker::UnfixString(json_string *value_t,bool flag,json_string *res)

{
  byte bVar1;
  pointer pcVar2;
  size_type sVar3;
  uchar extraout_DL;
  uchar extraout_DL_00;
  uchar p;
  uchar extraout_DL_01;
  undefined7 in_register_00000031;
  size_type sVar4;
  json_string local_50;
  
  if ((int)CONCAT71(in_register_00000031,flag) == 0) {
    std::__cxx11::string::append((string *)res);
  }
  else {
    pcVar2 = (value_t->_M_dataplus)._M_p;
    sVar3 = value_t->_M_string_length;
    p = (uchar)res;
    for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
      bVar1 = pcVar2[sVar4];
      switch(bVar1) {
      case 8:
        break;
      case 9:
        break;
      case 10:
        break;
      case 0xb:
switchD_001137b3_caseD_b:
        if ((byte)(bVar1 + 0x81) < 0xa1) {
          toUTF8_abi_cxx11_(&local_50,(JSONWorker *)(ulong)bVar1,p);
          std::__cxx11::string::append((string *)res);
          std::__cxx11::string::~string((string *)&local_50);
          p = extraout_DL_01;
        }
        else {
          std::__cxx11::string::push_back((uchar)res);
          p = extraout_DL;
        }
        goto LAB_00113823;
      case 0xc:
        break;
      case 0xd:
        break;
      default:
        if (((bVar1 != 0x5c) && (bVar1 != 0x2f)) && (bVar1 != 0x22)) goto switchD_001137b3_caseD_b;
      }
      std::__cxx11::string::append((char *)res);
      p = extraout_DL_00;
LAB_00113823:
    }
  }
  return;
}

Assistant:

void JSONWorker::UnfixString(const json_string & value_t, bool flag, json_string & res) json_nothrow {
    if (!flag){
		res += value_t;
		return;
	}
    //Re-escapes a json_string so that it can be written out into a JSON file
	const json_char * const end = value_t.data() + value_t.length();
    for(const json_char * p = value_t.data(); p != end; ++p){
	   switch(*p){
		  case JSON_TEXT('\"'):  //quote character
			 res += JSON_TEXT("\\\"");
			 break;
		  case JSON_TEXT('\\'):	//backslash
			 res += JSON_TEXT("\\\\");
			 break;
		  #ifdef JSON_ESCAPE_WRITES
			 case JSON_TEXT('\t'):	//tab character
				res += JSON_TEXT("\\t");
				break;
			 case JSON_TEXT('\n'):	//newline character
				res += JSON_TEXT("\\n");
				break;
			 case JSON_TEXT('\r'):	//return character
				res += JSON_TEXT("\\r");
				break;
			 case JSON_TEXT('/'):	//forward slash
				res += JSON_TEXT("\\/");
				break;
			 case JSON_TEXT('\b'):	//backspace
				res += JSON_TEXT("\\b");
				break;
			 case JSON_TEXT('\f'):	//formfeed
				res += JSON_TEXT("\\f");
				break;
			 default:
			 {
				if (json_unlikely(((json_uchar)(*p) < 32) || ((json_uchar)(*p) > 126))){
				    res += toUTF8((json_uchar)(*p));
				} else {
				    res += *p;
				}
			}
				break;
		  #else
			 default:
				res += *p;
				break;
		  #endif
	   }
    }
}